

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  FieldDescriptor *this_00;
  int iVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  reference ppFVar6;
  reference ppEVar7;
  FieldOptions *this_01;
  FileDescriptor *file;
  bool bVar8;
  FieldDescriptor *field;
  int j;
  int i_1;
  FieldDescriptor *last_weak_field;
  LazySerializerEmitter e;
  ExtensionRange *local_70 [3];
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  bool to_array_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  anon_unknown_0::SortFieldsByNumber
            ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this->descriptor_);
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            *)local_50);
  for (local_54 = 0; iVar2 = local_54, iVar1 = Descriptor::extension_range_count(this->descriptor_),
      iVar2 < iVar1; local_54 = local_54 + 1) {
    local_70[0] = Descriptor::extension_range(this->descriptor_,local_54);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_50,local_70);
  }
  iVar3 = std::
          vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_50);
  iVar4 = std::
          vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_50);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>
            (iVar3._M_current,iVar4._M_current);
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,
                       "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer(_weak_field_map_);\n"
                      );
  }
  io::Printer::Print(printer,
                     "::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n")
  ;
  GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::LazySerializerEmitter::
  LazySerializerEmitter(google::protobuf::compiler::cpp::MessageGenerator*,google::protobuf::io::
  Printer__bool_(&last_weak_field,this,printer,to_array);
  _j = (FieldDescriptor *)0x0;
  field._4_4_ = 0;
  field._0_4_ = 0;
  do {
    while( true ) {
      sVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&sorted_extensions.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar8 = true;
      if (sVar5 <= (ulong)(long)field._4_4_) {
        sVar5 = std::
                vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                        *)local_50);
        bVar8 = (ulong)(long)(int)field < sVar5;
      }
      if (!bVar8) {
        if (_j != (FieldDescriptor *)0x0) {
          GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
          LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__(&last_weak_field,_j)
          ;
        }
        GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::~LazySerializerEmitter
                  ((LazySerializerEmitter *)&last_weak_field);
        bVar8 = PreserveUnknownFields(this->descriptor_);
        if (bVar8) {
          file = Descriptor::file(this->descriptor_);
          bVar8 = UseUnknownFieldSet(file,&this->options_);
          if (bVar8) {
            io::Printer::Print(printer,"if (_internal_metadata_.have_unknown_fields()) {\n");
            io::Printer::Indent(printer);
            if (to_array) {
              io::Printer::Print(printer,
                                 "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
                                );
            }
            else {
              io::Printer::Print(printer,
                                 "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
                                );
            }
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
          }
          else {
            io::Printer::Print(printer,
                               "output->WriteRaw(unknown_fields().data(),\n                 static_cast<int>(unknown_fields().size()));\n"
                              );
          }
        }
        std::
        vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_50);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&sorted_extensions.
                      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return;
      }
      sVar5 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_50);
      if ((long)(int)field != sVar5) break;
LAB_003fb297:
      sVar5 = (size_type)field._4_4_;
      field._4_4_ = field._4_4_ + 1;
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)&sorted_extensions.
                                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar5);
      this_00 = *ppFVar6;
      this_01 = FieldDescriptor::options(this_00);
      bVar8 = FieldOptions::weak(this_01);
      if (bVar8) {
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,this_00);
        _j = this_00;
      }
      else {
        if (_j != (FieldDescriptor *)0x0) {
          GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
          LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__(&last_weak_field,_j)
          ;
          _j = (FieldDescriptor *)0x0;
        }
        GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
        LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                  (&last_weak_field,this_00);
      }
    }
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (field._4_4_ < iVar2) {
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)&sorted_extensions.
                                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)field._4_4_);
      iVar2 = FieldDescriptor::number(*ppFVar6);
      ppEVar7 = std::
                vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              *)local_50,(long)(int)field);
      if (iVar2 < (*ppEVar7)->start) goto LAB_003fb297;
    }
    if (_j != (FieldDescriptor *)0x0) {
      GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
      LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__(&last_weak_field,_j);
      _j = (FieldDescriptor *)0x0;
    }
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)&last_weak_field);
    sVar5 = (size_type)(int)field;
    field._0_4_ = (int)field + 1;
    ppEVar7 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                            *)local_50,sVar5);
    GenerateSerializeOneExtensionRange(this,printer,*ppEVar7,to_array);
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  // If there are multiple fields in a row from the same oneof then we
  // coalesce them and emit a switch statement.  This is more efficient
  // because it lets the C++ compiler know this is a "at most one can happen"
  // situation. If we emitted "if (has_x()) ...; if (has_y()) ..." the C++
  // compiler's emitted code might check has_y() even when has_x() is true.
  class LazySerializerEmitter {
   public:
    LazySerializerEmitter(MessageGenerator* mg, io::Printer* printer,
                          bool to_array)
        : mg_(mg),
          printer_(printer),
          to_array_(to_array),
          eager_(!HasFieldPresence(mg->descriptor_->file())),
          cached_has_bit_index_(-1) {}

    ~LazySerializerEmitter() { Flush(); }

    // If conditions allow, try to accumulate a run of fields from the same
    // oneof, and handle them at the next Flush().
    void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }

    void Flush() {
      if (!v_.empty()) {
        mg_->GenerateSerializeOneofFields(printer_, v_, to_array_);
        v_.clear();
      }
    }

   private:
    // If we have multiple fields in v_ then they all must be from the same
    // oneof.  Would adding field to v_ break that invariant?
    bool MustFlush(const FieldDescriptor* field) {
      return !v_.empty() &&
             v_[0]->containing_oneof() != field->containing_oneof();
    }

    MessageGenerator* mg_;
    io::Printer* printer_;
    const bool to_array_;
    const bool eager_;
    std::vector<const FieldDescriptor*> v_;

    // cached_has_bit_index_ maintains that:
    //   cached_has_bits = from._has_bits_[cached_has_bit_index_]
    // for cached_has_bit_index_ >= 0
    int cached_has_bit_index_;
  };

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  if (num_weak_fields_) {
    printer->Print(
        "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer("
        "_weak_field_map_);\n");
  }

  printer->Print(
      "::google::protobuf::uint32 cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  // Merge the fields and the extension ranges, both sorted by field number.
  {
    LazySerializerEmitter e(this, printer, to_array);
    const FieldDescriptor* last_weak_field = NULL;
    int i, j;
    for (i = 0, j = 0;
         i < ordered_fields.size() || j < sorted_extensions.size();) {
      if ((j == sorted_extensions.size()) ||
          (i < descriptor_->field_count() &&
           ordered_fields[i]->number() < sorted_extensions[j]->start)) {
        const FieldDescriptor* field = ordered_fields[i++];
        if (field->options().weak()) {
          last_weak_field = field;
          PrintFieldComment(printer, field);
        } else {
          if (last_weak_field != NULL) {
            e.Emit(last_weak_field);
            last_weak_field = NULL;
          }
          e.Emit(field);
        }
      } else  {
        if (last_weak_field != NULL) {
          e.Emit(last_weak_field);
          last_weak_field = NULL;
        }
        e.Flush();
        GenerateSerializeOneExtensionRange(printer,
                                           sorted_extensions[j++],
                                           to_array);
      }
    }
    if (last_weak_field != NULL) {
      e.Emit(last_weak_field);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print("if (_internal_metadata_.have_unknown_fields()) {\n");
      printer->Indent();
      if (to_array) {
        printer->Print(
          "target = "
              "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
          "    unknown_fields(), target);\n");
      } else {
        printer->Print(
          "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
          "    unknown_fields(), output);\n");
      }
      printer->Outdent();

      printer->Print(
        "}\n");
    } else {
      printer->Print(
        "output->WriteRaw(unknown_fields().data(),\n"
        "                 static_cast<int>(unknown_fields().size()));\n");
    }
  }
}